

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

void __thiscall RBTS<UF>::SecondScan(RBTS<UF> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  puVar4 = UF::P_;
  uVar5 = 1;
  if (1 < UF::length_) {
    uVar5 = 1;
    uVar7 = 1;
    do {
      if (puVar4[uVar7] < uVar7) {
        puVar4[uVar7] = puVar4[puVar4[uVar7]];
      }
      else {
        puVar4[uVar7] = uVar5;
        uVar5 = uVar5 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < UF::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
  puVar4 = UF::P_;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar2->field_0x8) {
    lVar6 = *(long *)&pMVar2->field_0x10;
    lVar3 = **(long **)&pMVar2->field_0x48;
    lVar8 = 0;
    do {
      iVar1 = *(int *)&pMVar2->field_0xc;
      if ((long)iVar1 != 0) {
        lVar9 = 0;
        do {
          *(uint *)(lVar6 + lVar9) = puVar4[*(uint *)(lVar6 + lVar9)];
          lVar9 = lVar9 + 4;
        } while ((long)iVar1 * 4 != lVar9);
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + lVar3;
    } while (lVar8 < *(int *)&pMVar2->field_0x8);
  }
  return;
}

Assistant:

static unsigned Flatten()
    {
        unsigned k = 1;
        for (unsigned i = 1; i < length_; ++i) {
            if (P_[i] < i) {
                P_[i] = P_[P_[i]];
            }
            else {
                P_[i] = k;
                k = k + 1;
            }
        }
        return k;
    }